

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

string * __thiscall
gnuplotio::GnuplotTmpfileCollection::make_tmpfile_abi_cxx11_
          (string *__return_storage_ptr__,GnuplotTmpfileCollection *this)

{
  pointer pcVar1;
  GnuplotTmpfile *this_00;
  shared_ptr<gnuplotio::GnuplotTmpfile> tmp_file;
  value_type local_28;
  
  this_00 = (GnuplotTmpfile *)operator_new(0x28);
  GnuplotTmpfile::GnuplotTmpfile(this_00,false);
  local_28.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<gnuplotio::GnuplotTmpfile*>
            (&local_28.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  std::
  vector<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ::push_back(&this->tmp_files,&local_28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = ((local_28.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->file).m_pathname._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + ((local_28.
                        super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->file).m_pathname._M_string_length);
  if (local_28.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_tmpfile() {
        const bool debug_messages = false;
        std::shared_ptr<GnuplotTmpfile> tmp_file(new GnuplotTmpfile(debug_messages));
        // The file will be removed once the pointer is removed from the
        // tmp_files container.
        tmp_files.push_back(tmp_file);
        return tmp_file->file.string();
    }